

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_27f4c0::PeerManagerImpl::RelayAddress
          (PeerManagerImpl *this,NodeId originator,CAddress *addr,bool fReachable)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  size_t data;
  time_point tVar5;
  CSipHasher *pCVar6;
  uint64_t uVar7;
  _Base_ptr p_Var8;
  undefined7 in_register_00000009;
  ulong uVar9;
  ulong *puVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock50;
  CSipHasher hasher;
  unique_lock<std::mutex> local_c8;
  ulong local_b8 [4];
  CSipHasher local_98;
  CSipHasher local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((int)CONCAT71(in_register_00000009,fReachable) != 0) ||
     ((addr->super_CService).super_CNetAddr.m_net - NET_IPV4 < 5)) {
    local_68.v[0] = 0;
    local_68.v[1] = 0;
    data = CServiceHash::operator()((CServiceHash *)&local_68,&addr->super_CService);
    tVar5 = NodeClock::now();
    CConnman::GetDeterministicRandomizer(&local_98,this->m_connman,0x3cac0035b5866b90);
    pCVar6 = CSipHasher::Write(&local_98,data);
    pCVar6 = CSipHasher::Write(pCVar6,((long)tVar5.__d.__r / 1000000000 + data) / 0x15180);
    local_68.v[0] = pCVar6->v[0];
    local_68.v[1] = pCVar6->v[1];
    local_68.v[2] = pCVar6->v[2];
    local_68.v[3]._0_1_ = (undefined1)pCVar6->v[3];
    local_68.v[3]._1_7_ = (undefined7)(pCVar6->v[3] >> 8);
    local_68.tmp._0_1_ = (undefined1)pCVar6->tmp;
    local_68.tmp._1_7_ = (undefined7)(pCVar6->tmp >> 8);
    local_68.count = (uint8_t)*(undefined8 *)&pCVar6->count;
    local_68._41_7_ = SUB87((ulong)*(undefined8 *)&pCVar6->count >> 8,0);
    iVar13 = 2;
    if (!fReachable) {
      uVar7 = CSipHasher::Finalize(&local_68);
      iVar13 = ((uint)uVar7 & 1) + 1;
    }
    local_b8[2] = 0;
    local_b8[3] = 0;
    local_b8[0] = 0;
    local_b8[1] = 0;
    local_c8._M_device = &(this->m_peer_mutex).super_mutex;
    local_c8._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_c8);
    p_Var8 = (this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      do {
        if (((((ulong)p_Var8[1]._M_parent[8]._M_right & 1) != 0) &&
            (*(long *)(p_Var8 + 1) != originator)) &&
           ((((ulong)p_Var8[1]._M_parent[10]._M_right & 1) != 0 ||
            (bVar4 = CNetAddr::IsAddrV1Compatible((CNetAddr *)addr), bVar4)))) {
          local_98.count = local_68.count;
          local_98.tmp._1_7_ = local_68.tmp._1_7_;
          local_98.tmp._0_1_ = (undefined1)local_68.tmp;
          local_98.v[2] = local_68.v[2];
          local_98.v[3]._0_1_ = (undefined1)local_68.v[3];
          local_98.v[3]._1_7_ = local_68.v[3]._1_7_;
          local_98.v[0] = local_68.v[0];
          local_98.v[1] = local_68.v[1];
          pCVar6 = CSipHasher::Write(&local_98,*(uint64_t *)(p_Var8 + 1));
          uVar7 = CSipHasher::Finalize(pCVar6);
          puVar10 = local_b8 + 3;
          uVar9 = 0;
LAB_001d96b4:
          uVar2 = *(ulong *)((long)local_b8 + uVar9);
          if (uVar7 <= uVar2) goto code_r0x001d96be;
          lVar11 = (long)(((ulong)(uint)(iVar13 << 4) - 0x10) - uVar9) >> 4;
          if (0 < lVar11) {
            uVar12 = lVar11 + 1;
            do {
              puVar10[-1] = uVar2;
              *puVar10 = puVar10[-2];
              uVar12 = uVar12 - 1;
              puVar10 = puVar10 + 2;
            } while (1 < uVar12);
          }
          p_Var3 = p_Var8[1]._M_parent;
          *(uint64_t *)((long)local_b8 + uVar9) = uVar7;
          *(_Base_ptr *)((long)local_b8 + uVar9 + 8) = p_Var3;
        }
LAB_001d9706:
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var1);
    }
    uVar9 = 0;
    do {
      if (*(long *)((long)local_b8 + uVar9) == 0) break;
      PushAddress(this,*(Peer **)((long)local_b8 + uVar9 + 8),addr);
      uVar9 = uVar9 + 0x10;
    } while ((uint)(iVar13 << 4) != uVar9);
    std::unique_lock<std::mutex>::~unique_lock(&local_c8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
code_r0x001d96be:
  uVar9 = uVar9 + 0x10;
  puVar10 = puVar10 + 2;
  if ((uint)(iVar13 << 4) == uVar9) goto LAB_001d9706;
  goto LAB_001d96b4;
}

Assistant:

void PeerManagerImpl::RelayAddress(NodeId originator,
                                   const CAddress& addr,
                                   bool fReachable)
{
    // We choose the same nodes within a given 24h window (if the list of connected
    // nodes does not change) and we don't relay to nodes that already know an
    // address. So within 24h we will likely relay a given address once. This is to
    // prevent a peer from unjustly giving their address better propagation by sending
    // it to us repeatedly.

    if (!fReachable && !addr.IsRelayable()) return;

    // Relay to a limited number of other nodes
    // Use deterministic randomness to send to the same nodes for 24 hours
    // at a time so the m_addr_knowns of the chosen nodes prevent repeats
    const uint64_t hash_addr{CServiceHash(0, 0)(addr)};
    const auto current_time{GetTime<std::chrono::seconds>()};
    // Adding address hash makes exact rotation time different per address, while preserving periodicity.
    const uint64_t time_addr{(static_cast<uint64_t>(count_seconds(current_time)) + hash_addr) / count_seconds(ROTATE_ADDR_RELAY_DEST_INTERVAL)};
    const CSipHasher hasher{m_connman.GetDeterministicRandomizer(RANDOMIZER_ID_ADDRESS_RELAY)
                                .Write(hash_addr)
                                .Write(time_addr)};

    // Relay reachable addresses to 2 peers. Unreachable addresses are relayed randomly to 1 or 2 peers.
    unsigned int nRelayNodes = (fReachable || (hasher.Finalize() & 1)) ? 2 : 1;

    std::array<std::pair<uint64_t, Peer*>, 2> best{{{0, nullptr}, {0, nullptr}}};
    assert(nRelayNodes <= best.size());

    LOCK(m_peer_mutex);

    for (auto& [id, peer] : m_peer_map) {
        if (peer->m_addr_relay_enabled && id != originator && IsAddrCompatible(*peer, addr)) {
            uint64_t hashKey = CSipHasher(hasher).Write(id).Finalize();
            for (unsigned int i = 0; i < nRelayNodes; i++) {
                 if (hashKey > best[i].first) {
                     std::copy(best.begin() + i, best.begin() + nRelayNodes - 1, best.begin() + i + 1);
                     best[i] = std::make_pair(hashKey, peer.get());
                     break;
                 }
            }
        }
    };

    for (unsigned int i = 0; i < nRelayNodes && best[i].first != 0; i++) {
        PushAddress(*best[i].second, addr);
    }
}